

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# questpgr.c
# Opt level: O1

void convert_line(void)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  short sVar4;
  boolean bVar5;
  int iVar6;
  char *pcVar7;
  dungeon *pdVar8;
  char *pcVar9;
  size_t sVar10;
  char *__dest;
  aligntyp aVar11;
  char *pcVar12;
  long lVar13;
  bool bVar14;
  
  if (in_line[0] == '\0') {
    __dest = out_line;
    bVar14 = true;
  }
  else {
    pcVar12 = in_line;
    __dest = out_line;
    lVar13 = 0;
    do {
      out_line[lVar13] = '\0';
      cVar1 = *pcVar12;
      if (cVar1 != '%') {
        if ((cVar1 != '\r') && (cVar1 != '\n')) {
LAB_0022a1a0:
          lVar13 = lVar13 + 1;
          *__dest = cVar1;
          goto LAB_0022a5c5;
        }
        __dest = __dest + 1;
        goto LAB_0022a680;
      }
      cVar2 = pcVar12[1];
      pcVar9 = plname;
      switch(cVar2) {
      case 'A':
        aVar11 = u.ualign.type;
        goto LAB_0022a27c;
      case 'B':
      case 'E':
      case 'F':
      case 'I':
      case 'J':
      case 'K':
      case 'M':
      case 'O':
      case 'P':
      case 'Q':
      case 'T':
      case 'U':
      case 'V':
      case 'W':
      case 'X':
      case 'Y':
      case '[':
      case '\\':
      case ']':
      case '^':
      case '_':
      case '`':
      case 'b':
      case 'e':
      case 'f':
      case 'h':
      case 'j':
      case 'k':
      case 'q':
      case 't':
      case 'u':
      case 'v':
      case 'w':
switchD_0022a1ce_caseD_42:
        pcVar9 = ((dungeon *)0x2a8957)->dname;
        break;
      case 'C':
        pcVar9 = "chaotic";
        break;
      case 'D':
        aVar11 = '\x01';
        goto LAB_0022a2ef;
      case 'G':
        pcVar9 = align_gtitle(u.ualignbase[1]);
        break;
      case 'H':
        pcVar9 = urole.homebase;
        break;
      case 'L':
        pcVar9 = "lawful";
        break;
      case 'N':
        pcVar9 = "neutral";
        break;
      case 'R':
        iVar6 = 10;
        goto LAB_0022a471;
      case 'S':
        bVar14 = flags.female == '\0';
        pcVar9 = "daughter";
        pdVar8 = (dungeon *)0x2db36f;
        goto LAB_0022a42c;
      case 'Z':
        pcVar9 = dungeons[0].dname;
        break;
      case 'a':
        aVar11 = u.ualignbase[1];
LAB_0022a27c:
        pcVar9 = align_str(aVar11);
        break;
      case 'c':
        pcVar9 = urole.name.f;
        if (urole.name.f == (char *)0x0) {
          pcVar9 = urole.name.m;
        }
        bVar14 = flags.female == '\0';
        pdVar8 = (dungeon *)urole.name.m;
        goto LAB_0022a42c;
      case 'd':
        aVar11 = u.ualignbase[1];
LAB_0022a2ef:
        pcVar9 = align_gname(aVar11);
        break;
      case 'g':
        pcVar9 = mons_mname(mons + urole.guardnum);
        break;
      case 'i':
        pcVar9 = urole.intermed;
        break;
      case 'l':
        sVar4 = urole.ldrnum;
        goto LAB_0022a365;
      case 'm':
        bVar5 = pirateday();
        pcVar9 = "the FSM";
        if (bVar5 == '\0') {
          bVar5 = discordian_holiday();
          if (bVar5 != '\0') {
            bVar14 = (u.ubirthday & 1U) == 0;
            pcVar9 = "Discordia";
            pdVar8 = (dungeon *)"Eris";
            goto LAB_0022a42c;
          }
          pcVar9 = (char *)(creator_names_rel +
                           *(int *)(creator_names_rel + (u.ubirthday % 0x13) * 4));
        }
        break;
      case 'n':
        sVar4 = urole.neminum;
LAB_0022a365:
        pcVar9 = "";
        if ((mons[sVar4].mflags2 & 0x80000) == 0) {
          pcVar9 = "the ";
        }
        pcVar7 = mons_mname(mons + sVar4);
        sprintf(nambuf,"%s%s",pcVar9,pcVar7);
        pcVar9 = nambuf;
        break;
      case 'o':
        pcVar9 = artiname((int)urole.questarti);
        pcVar9 = the(pcVar9);
        break;
      case 'p':
        break;
      case 'r':
        iVar6 = u.ulevel;
LAB_0022a471:
        pcVar9 = rank_of(iVar6,urole.malenum,flags.female);
        break;
      case 's':
        bVar14 = flags.female == '\0';
        pcVar9 = "sister";
        pdVar8 = (dungeon *)"brother";
LAB_0022a42c:
        if (bVar14) {
          pcVar9 = pdVar8->dname;
        }
        break;
      case 'x':
        if (((u.uprops[0x1e].intrinsic != 0) ||
            (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
             (pcVar9 = ((dungeon *)0x2a7dc4)->dname, ((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
           (pcVar9 = "sense", ublindf != (obj *)0x0)) {
          bVar14 = ublindf->oartifact == '\x1d';
          pcVar9 = "sense";
          pdVar8 = (dungeon *)0x2a7dc4;
          goto LAB_0022a42c;
        }
        break;
      default:
        if (cVar2 == '\0') goto LAB_0022a1a0;
        if (cVar2 != '%') goto switchD_0022a1ce_caseD_42;
        pcVar9 = ((dungeon *)0x2d8ae0)->dname;
      }
      pcVar7 = pcVar12 + 1;
      strcpy(cvt_buf,pcVar9);
      bVar3 = pcVar12[2];
      pcVar12 = pcVar12 + 2;
      if (bVar3 < 0x61) {
        if (bVar3 < 0x50) {
          if (bVar3 == 0x41) {
            pcVar9 = An(cvt_buf);
            goto LAB_0022a572;
          }
          if (bVar3 == 0x43) {
            cvt_buf[0] = highc(cvt_buf[0]);
            pcVar7 = pcVar12;
          }
        }
        else if (bVar3 == 0x50) {
          cvt_buf[0] = highc(cvt_buf[0]);
LAB_0022a596:
          pcVar9 = makeplural(cvt_buf);
LAB_0022a59e:
          strcpy(cvt_buf,pcVar9);
          pcVar7 = pcVar12;
        }
        else if (bVar3 == 0x53) {
          cvt_buf[0] = highc(cvt_buf[0]);
          goto LAB_0022a550;
        }
LAB_0022a5ac:
        pcVar12 = pcVar7;
        strcat(__dest,cvt_buf);
        sVar10 = strlen(cvt_buf);
        lVar13 = lVar13 + sVar10;
      }
      else {
        if (bVar3 < 0x73) {
          if (bVar3 != 0x61) {
            if (bVar3 == 0x70) goto LAB_0022a596;
            goto LAB_0022a5ac;
          }
          pcVar9 = an(cvt_buf);
        }
        else {
          if (bVar3 == 0x73) {
LAB_0022a550:
            pcVar9 = s_suffix(cvt_buf);
            goto LAB_0022a59e;
          }
          if ((bVar3 != 0x74) ||
             (iVar6 = strncasecmp(cvt_buf,"the ",4), pcVar7 = pcVar12, iVar6 != 0))
          goto LAB_0022a5ac;
          pcVar9 = cvt_buf + 4;
        }
LAB_0022a572:
        strcat(__dest,pcVar9);
        sVar10 = strlen(__dest);
        lVar13 = lVar13 + sVar10;
      }
LAB_0022a5c5:
      pcVar9 = pcVar12 + 1;
      pcVar12 = pcVar12 + 1;
      __dest = out_line + lVar13;
    } while (*pcVar9 != '\0');
    bVar14 = lVar13 < 0x80;
  }
  if (!bVar14) {
    panic("convert_line: overflow");
  }
LAB_0022a680:
  *__dest = '\0';
  return;
}

Assistant:

static void convert_line(void)
{
	char *c, *cc;

	cc = out_line;
	for (c = in_line; *c; c++) {

	    *cc = 0;
	    switch(*c) {

		case '\r':
		case '\n':
			*(++cc) = 0;
			return;

		case '%':
			if (*(c+1)) {
			    convert_arg(*(++c));
			    switch (*(++c)) {

					/* insert "a"/"an" prefix */
				case 'A': strcat(cc, An(cvt_buf));
				    cc += strlen(cc);
				    continue; /* for */
				case 'a': strcat(cc, an(cvt_buf));
				    cc += strlen(cc);
				    continue; /* for */

					/* capitalize */
				case 'C': cvt_buf[0] = highc(cvt_buf[0]);
				    break;

					/* pluralize */
				case 'P': cvt_buf[0] = highc(cvt_buf[0]);
				case 'p': strcpy(cvt_buf, makeplural(cvt_buf));
				    break;

					/* append possessive suffix */
				case 'S': cvt_buf[0] = highc(cvt_buf[0]);
				case 's': strcpy(cvt_buf, s_suffix(cvt_buf));
				    break;

					/* strip any "the" prefix */
				case 't': if (!strncmpi(cvt_buf, "the ", 4)) {
					strcat(cc, &cvt_buf[4]);
					cc += strlen(cc);
					continue; /* for */
				    }
				    break;

				default: --c;	/* undo switch increment */
				    break;
			    }
			    strcat(cc, cvt_buf);
			    cc += strlen(cvt_buf);
			    break;
			}	/* else fall through */

		default:
			*cc++ = *c;
			break;
	    }
	}
	if (cc >= out_line + sizeof out_line)
	    panic("convert_line: overflow");
	*cc = 0;
	return;
}